

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O0

void __thiscall EhFrame::EhFrame(EhFrame *this,BYTE *buffer,size_t size)

{
  RegNum RVar1;
  ULEB128 local_3c;
  ULEB128 local_38;
  ULEB128 local_34;
  undefined1 local_30 [8];
  CIE cie;
  size_t size_local;
  BYTE *buffer_local;
  EhFrame *this_local;
  
  cie.super_Entry.beginOffset = size;
  Writer::Writer(&this->writer,buffer,size);
  FDE::FDE(&this->fde,&this->writer);
  CIE::CIE((CIE *)local_30,&this->writer);
  CIE::Begin((CIE *)local_30);
  RVar1 = LowererMDArch::GetRegStackPointer();
  LEB128Wrapper<unsigned_int>::LEB128Wrapper(&local_34,(uint)DWARF_RegNum[RVar1]);
  LEB128Wrapper<unsigned_int>::LEB128Wrapper(&local_38,8);
  Entry::cfi_def_cfa((Entry *)local_30,local_34,local_38);
  LEB128Wrapper<unsigned_int>::LEB128Wrapper(&local_3c,1);
  Entry::cfi_offset((Entry *)local_30,'\x10',local_3c);
  Entry::End((Entry *)local_30);
  FDE::Begin(&this->fde);
  return;
}

Assistant:

EhFrame::EhFrame(BYTE* buffer, size_t size)
        : writer(buffer, size), fde(&writer)
{
    CIE cie(&writer);
    cie.Begin();

    // CIE initial instructions
    // DW_CFA_def_cfa: r7 (rsp) ofs 8
    cie.cfi_def_cfa(DWARF_RegNum[LowererMDArch::GetRegStackPointer()], MachPtr);
    // DW_CFA_offset: r16 (rip) at cfa-8 (data alignment -8)
    cie.cfi_offset(DWARF_RegRA, 1);

    cie.End();

    fde.Begin();
}